

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O2

settings_r * open_settings_r(char *sessionname)

{
  char *pcVar1;
  FILE *__stream;
  settings_r *psVar2;
  tree234 *ptVar3;
  char *pcVar4;
  size_t sVar5;
  undefined8 *e;
  char *pcVar6;
  
  pcVar1 = make_filename(5,sessionname);
  __stream = fopen(pcVar1,"r");
  safefree(pcVar1);
  if (__stream == (FILE *)0x0) {
    psVar2 = (settings_r *)0x0;
  }
  else {
    psVar2 = (settings_r *)safemalloc(1,8,0);
    ptVar3 = newtree234(keycmp);
    psVar2->t = ptVar3;
    while( true ) {
      pcVar1 = fgetline((FILE *)__stream);
      if (pcVar1 == (char *)0x0) break;
      pcVar4 = strchr(pcVar1,0x3d);
      if (pcVar4 != (char *)0x0) {
        *pcVar4 = '\0';
        sVar5 = strcspn(pcVar4 + 1,"\r\n");
        pcVar4[sVar5 + 1] = '\0';
        e = (undefined8 *)safemalloc(1,0x10,0);
        pcVar6 = dupstr(pcVar1);
        *e = pcVar6;
        pcVar4 = dupstr(pcVar4 + 1);
        e[1] = pcVar4;
        add234(psVar2->t,e);
      }
      safefree(pcVar1);
    }
    fclose(__stream);
  }
  return psVar2;
}

Assistant:

settings_r *open_settings_r(const char *sessionname)
{
    char *filename;
    FILE *fp;
    char *line;
    settings_r *toret;

    filename = make_filename(INDEX_SESSION, sessionname);
    fp = fopen(filename, "r");
    sfree(filename);
    if (!fp)
        return NULL;                   /* can't open */

    toret = snew(settings_r);
    toret->t = newtree234(keycmp);

    while ( (line = fgetline(fp)) ) {
        char *value = strchr(line, '=');
        struct skeyval *kv;

        if (!value) {
            sfree(line);
            continue;
        }
        *value++ = '\0';
        value[strcspn(value, "\r\n")] = '\0';   /* trim trailing NL */

        kv = snew(struct skeyval);
        kv->key = dupstr(line);
        kv->value = dupstr(value);
        add234(toret->t, kv);

        sfree(line);
    }

    fclose(fp);

    return toret;
}